

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::VerifyAssignmentVisitor::check_var(Var *var)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  StmtException *this;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  basic_string_view<char> bVar6;
  string_view format_str;
  format_args args;
  Stmt **local_a0;
  undefined8 uStack_98;
  const_iterator local_80;
  string local_78;
  const_iterator local_58;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  plVar3 = (long *)(CONCAT44(extraout_var,iVar1) + 0x10);
  plVar4 = plVar3;
  do {
    plVar4 = (long *)*plVar4;
    if (plVar4 == (long *)0x0) {
      return;
    }
    lVar2 = (**(code **)(*(long *)plVar4[1] + 0x20))();
    plVar5 = plVar3;
  } while (*(int *)(lVar2 + 0x48) != 0);
  do {
    plVar5 = (long *)*plVar5;
    if (plVar5 == (long *)0x0) {
      return;
    }
    lVar2 = (**(code **)(*(long *)plVar5[1] + 0x20))();
  } while (*(int *)(lVar2 + 0x48) == 0);
  auStack_48 = (undefined1  [8])0x0;
  stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
            ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)auStack_48,
             *(size_type *)(CONCAT44(extraout_var,iVar1) + 0x18));
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    local_78._M_dataplus._M_p = (pointer)plVar3[1];
    std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::AssignStmt*>
              ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_48,
               (AssignStmt **)&local_78);
  }
  this = (StmtException *)__cxa_allocate_exception(0x10);
  (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_a0,var);
  local_58._M_current = local_a0;
  uStack_50 = uStack_98;
  bVar6 = fmt::v7::to_string_view<char,_0>
                    ("{0} has wire assignment yet is also used in always block");
  format_str.data_ = (char *)bVar6.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar6.data_,format_str,args);
  local_58._M_current = (Stmt **)auStack_48;
  local_80._M_current =
       stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  StmtException::StmtException(this,&local_78,&local_58,&local_80);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void inline static check_var(Var* var) {
        bool is_top_level = false;
        auto const& sources = var->sources();
        for (auto const& stmt : sources) {
            if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                is_top_level = true;
                break;
            }
        }

        // second pass the check all the assignments
        bool has_error = false;
        if (is_top_level) {
            for (auto const& stmt : sources) {
                if (stmt->parent()->ir_node_kind() != IRNodeKind::GeneratorKind) {
                    has_error = true;
                    break;
                }
            }
        }

        if (has_error) {
            std::vector<Stmt*> stmt_list;
            stmt_list.reserve(sources.size());
            // prepare the error
            for (auto const& stmt : sources) {
                stmt_list.emplace_back(stmt.get());
            }
            throw StmtException(::format("{0} has wire assignment yet is also used in always block",
                                         var->to_string()),
                                stmt_list.begin(), stmt_list.end());
        }
    }